

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

bool __thiscall CoinsViewScanReserver::reserve(CoinsViewScanReserver *this)

{
  atomic<bool> aVar1;
  long in_FS_OFFSET;
  bool local_1a;
  bool local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_19 = (bool)(this->m_could_reserve ^ 1);
  inline_check_non_fatal<bool>
            (&local_19,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp"
             ,0x858,"reserve","!m_could_reserve");
  aVar1 = g_scan_in_progress;
  LOCK();
  g_scan_in_progress._M_base._M_i = (__atomic_base<bool>)true;
  UNLOCK();
  if (((byte)aVar1._M_base._M_i & 1) == 0) {
    local_1a = g_scan_progress.super___atomic_base<int>._M_i == 0;
    inline_check_non_fatal<bool>
              (&local_1a,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp"
               ,0x85c,"reserve","g_scan_progress == 0");
    this->m_could_reserve = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (bool)(((byte)aVar1._M_base._M_i ^ 1) & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool reserve() {
        CHECK_NONFATAL(!m_could_reserve);
        if (g_scan_in_progress.exchange(true)) {
            return false;
        }
        CHECK_NONFATAL(g_scan_progress == 0);
        m_could_reserve = true;
        return true;
    }